

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O0

GCcdata * lj_cdata_newx(CTState *cts,CTypeID id,CTSize sz,CTInfo info)

{
  GCcdata *pGVar1;
  ulong uVar2;
  uint in_ECX;
  uint16_t in_SI;
  long in_RDI;
  undefined4 unaff_retaddr;
  GCcdata *cd;
  lua_State *in_stack_ffffffffffffffd0;
  CTSize in_stack_fffffffffffffff4;
  undefined8 in_stack_fffffffffffffff8;
  
  if (((in_ECX & 0x100000) == 0) && ((in_ECX >> 0x10 & 0xf) < 4)) {
    pGVar1 = (GCcdata *)lj_mem_newgco(in_stack_ffffffffffffffd0,(GCSize)((ulong)in_RDI >> 0x20));
    pGVar1->gct = '\n';
    pGVar1->ctypeid = in_SI;
    uVar2 = (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + 8);
    *(long *)(uVar2 + 0xe0) = *(long *)(uVar2 + 0xe0) + 1;
  }
  else {
    pGVar1 = lj_cdata_newv((lua_State *)CONCAT44(info,unaff_retaddr),
                           (CTypeID)((ulong)in_stack_fffffffffffffff8 >> 0x20),
                           (CTSize)in_stack_fffffffffffffff8,in_stack_fffffffffffffff4);
  }
  return pGVar1;
}

Assistant:

GCcdata *lj_cdata_newx(CTState *cts, CTypeID id, CTSize sz, CTInfo info)
{
  if (!(info & CTF_VLA) && ctype_align(info) <= CT_MEMALIGN)
    return lj_cdata_new(cts, id, sz);
  else
    return lj_cdata_newv(cts->L, id, sz, ctype_align(info));
}